

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::BeginLoopInst::Exec
          (BeginLoopInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  CharCount CVar1;
  Label LVar2;
  Type TVar3;
  uint uVar4;
  PageAllocation *pPVar5;
  size_t sVar6;
  uint8 *puVar7;
  Program *pPVar8;
  uint8 *puVar9;
  code *pcVar10;
  bool bVar11;
  undefined4 *puVar12;
  List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this_00;
  ArenaAllocator *alloc;
  int iVar13;
  uchar *puVar14;
  LoopInfo *pLVar15;
  
  iVar13 = (this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId;
  if (((long)iVar13 < 0) || (((matcher->program).ptr)->numLoops <= iVar13)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                        "loopId >= 0 && loopId < program->numLoops");
    if (!bVar11) goto LAB_00f0aebc;
    *puVar12 = 0;
  }
  pLVar15 = (matcher->loopInfos).ptr + iVar13;
  if (((this->super_GreedyMixin).isGreedy == false) &&
     ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.hasOuterLoops == true)) {
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize -
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop < 0x28) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x28);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                          ,199,"(bufferSize)","bufferSize");
      if (!bVar11) goto LAB_00f0aebc;
      *puVar12 = 0;
    }
    pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar6 + 0x28;
    *(size_t *)((long)&pPVar5[1].pageCount + sVar6) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x28;
    iVar13 = (this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId;
    *(undefined1 *)((long)&pPVar5[2].pageCount + sVar6) = 1;
    *(undefined ***)((long)&pPVar5[1].segment + sVar6) = &PTR_Print_01559968;
    *(int *)((long)&pPVar5[2].pageCount + sVar6 + 4) = iVar13;
    *(CharCount *)((long)&pPVar5[2].segment + sVar6) = pLVar15->number;
    *(CharCount *)((long)&pPVar5[2].segment + sVar6 + 4) = pLVar15->startInputOffset;
    *(undefined8 *)((long)&pPVar5[3].pageCount + sVar6) = 0;
    if (pLVar15->offsetsOfFollowFirst !=
        (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        0x0) {
      alloc = &((((((matcher->pattern).ptr)->library).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->regexAllocator;
      this_00 = (List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
      *(undefined8 *)(this_00 + 8) = 0;
      *(undefined4 *)(this_00 + 0x10) = 0;
      *(ArenaAllocator **)(this_00 + 0x18) = alloc;
      *(undefined ***)this_00 = &PTR_IsReadOnly_014ea098;
      *(undefined8 *)(this_00 + 0x20) = 0x400000000;
      *(List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> **)
       ((long)&pPVar5[3].pageCount + sVar6) = this_00;
      JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
      Copy<JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                (this_00,pLVar15->offsetsOfFollowFirst);
    }
    Matcher::PushStats(matcher,contStack,input);
  }
  iVar13 = (this->super_BodyGroupsMixin).minBodyGroupId;
  if (iVar13 <= (this->super_BodyGroupsMixin).maxBodyGroupId) {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if ((iVar13 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar13)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                            ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                            "groupId >= 0 && groupId < program->numGroups");
        if (!bVar11) goto LAB_00f0aebc;
        *puVar12 = 0;
      }
      if ((matcher->groupInfos).ptr[iVar13].length != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                            ,0xb58,"(matcher.GroupIdToGroupInfo(i)->IsUndefined())",
                            "matcher.GroupIdToGroupInfo(i)->IsUndefined()");
        if (!bVar11) goto LAB_00f0aebc;
        *puVar12 = 0;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 <= (this->super_BodyGroupsMixin).maxBodyGroupId);
  }
  pLVar15->number = 0;
  pLVar15->startInputOffset = *inputOffset;
  if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower == 0) {
    if ((this->super_GreedyMixin).isGreedy == true) {
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize -
          (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop < 0x20) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
      }
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                            ,199,"(bufferSize)","bufferSize");
        if (!bVar11) {
LAB_00f0aebc:
          pcVar10 = (code *)invalidInstructionException();
          (*pcVar10)();
        }
        *puVar12 = 0;
      }
      pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar6 + 0x20;
      *(size_t *)((long)&pPVar5[1].pageCount + sVar6) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x20;
      CVar1 = *inputOffset;
      LVar2 = (this->super_BeginLoopMixin).exitLabel;
      *(undefined1 *)((long)&pPVar5[2].pageCount + sVar6) = 0;
      *(undefined ***)((long)&pPVar5[1].segment + sVar6) = &PTR_Print_01559788;
      *(CharCount *)((long)&pPVar5[2].pageCount + sVar6 + 4) = CVar1;
      *(Label *)((long)&pPVar5[2].segment + sVar6) = LVar2;
      puVar14 = *instPointer + 0x1c;
    }
    else {
      if ((BeginLoopInst *)*instPointer != this) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                            ,0xb6a,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
        if (!bVar11) goto LAB_00f0aebc;
        *puVar12 = 0;
      }
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize -
          (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop < 0x20) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
      }
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                            ,199,"(bufferSize)","bufferSize");
        if (!bVar11) goto LAB_00f0aebc;
        *puVar12 = 0;
      }
      pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar6 + 0x20;
      *(size_t *)((long)&pPVar5[1].pageCount + sVar6) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x20;
      puVar7 = *instPointer;
      pPVar8 = (matcher->program).ptr;
      puVar9 = *(uint8 **)&pPVar8->rep;
      if ((puVar7 < puVar9) || (puVar9 + (pPVar8->rep).insts.instsLen <= puVar7)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                            ,0x767,
                            "(inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen)"
                            ,
                            "inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen"
                           );
        if (!bVar11) goto LAB_00f0aebc;
        *puVar12 = 0;
      }
      pPVar8 = (matcher->program).ptr;
      TVar3 = (pPVar8->rep).boiLiteral2.literal;
      CVar1 = *inputOffset;
      *(undefined1 *)((long)&pPVar5[2].pageCount + sVar6) = 5;
      *(undefined ***)((long)&pPVar5[1].segment + sVar6) = &PTR_Print_01559848;
      *(Type *)((long)&pPVar5[2].pageCount + sVar6 + 4) = (int)puVar7 - TVar3;
      *(CharCount *)((long)&pPVar5[2].segment + sVar6) = CVar1;
      uVar4 = (this->super_BeginLoopMixin).exitLabel;
      if ((pPVar8->rep).insts.instsLen <= uVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                            ,0x76d,"(label < program->rep.insts.instsLen)",
                            "label < program->rep.insts.instsLen");
        if (!bVar11) goto LAB_00f0aebc;
        *puVar12 = 0;
      }
      puVar14 = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar4;
    }
    *instPointer = puVar14;
    Matcher::PushStats(matcher,contStack,input);
  }
  else {
    *instPointer = *instPointer + 0x1c;
  }
  return false;
}

Assistant:

inline bool BeginLoopInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop has outer loops, the continuation stack may have choicepoints from an earlier "run" of this loop
        // which, when backtracked to, may expect the loopInfo state to be as it was at the time the choicepoint was
        // pushed.
        //  - If the loop is greedy with deterministic body, there may be Resumes into the follow of the loop, but
        //    they won't look at the loopInfo state so there's nothing to do.
        //  - If the loop is greedy, or if it is non-greedy with lower > 0, AND it has a non-deterministic body,
        //    we may have Resume entries which will resume inside the loop body, which may then run to a
        //    RepeatLoop, which will then look at the loopInfo state. However, each iteration is protected by
        //    a RestoreLoop by RepeatLoopInst below. (****)
        //  - If the loop is non-greedy there may be a RepeatLoop on the stack, so we must restore the loopInfo
        //    state before backtracking to it.
        if (!isGreedy && hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // The loop body must always begin with empty inner groups
        //  - if the loop is not in an outer they will be empty due to the reset when the match began
        //  - if the loop is in an outer loop, they will have been reset by the outer loop's RepeatLoop instruction
#if DBG
        for (int i = minBodyGroupId; i <= maxBodyGroupId; i++)
        {
            Assert(matcher.GroupIdToGroupInfo(i)->IsUndefined());
        }
#endif

        loopInfo->number = 0;
        loopInfo->startInputOffset = inputOffset;

        if (repeats.lower == 0)
        {
            if (isGreedy)
            {
                // CHOICEPOINT: Try one iteration of body, if backtrack continue from here with no iterations
                PUSH(contStack, ResumeCont, inputOffset, exitLabel);
                instPointer += sizeof(*this);
            }
            else
            {
                // CHOICEPOINT: Try no iterations of body, if backtrack do one iteration of body from here
                Assert(instPointer == (uint8*)this);
                PUSH(contStack, RepeatLoopCont, matcher.InstPointerToLabel(instPointer), inputOffset);
                instPointer = matcher.LabelToInstPointer(exitLabel);
            }
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        else
        {
            // Must match minimum iterations, so continue to loop body
            instPointer += sizeof(*this);
        }

        return false;
    }